

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

void __thiscall zmq::ctx_t::~ctx_t(ctx_t *this)

{
  void *pvVar1;
  undefined1 uVar2;
  mutex_t *pmVar3;
  reference ppiVar4;
  long in_RDI;
  size_type i_1;
  size_type i;
  size_type io_threads_size;
  reaper_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  mutex_t *this_00;
  mutex_t *local_18;
  
  uVar2 = array_t<zmq::socket_base_t,_0>::empty((array_t<zmq::socket_base_t,_0> *)0x1d3d64);
  if (((uVar2 ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_sockets.empty ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ctx.cpp"
            ,0x74);
    fflush(_stderr);
    zmq_abort((char *)0x1d3dc2);
  }
  pmVar3 = (mutex_t *)
           std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::size
                     ((vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_> *)
                      (in_RDI + 0x100));
  for (local_18 = (mutex_t *)0x0; local_18 != pmVar3;
      local_18 = (mutex_t *)((long)&local_18->_mutex + 1)) {
    std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::operator[]
              ((vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_> *)(in_RDI + 0x100),
               (size_type)local_18);
    io_thread_t::stop((io_thread_t *)0x1d3e13);
  }
  for (this_00 = (mutex_t *)0x0; this_00 != pmVar3;
      this_00 = (mutex_t *)((long)&(this_00->_mutex).__align + 1)) {
    ppiVar4 = std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::operator[]
                        ((vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_> *)
                         (in_RDI + 0x100),(size_type)this_00);
    in_stack_ffffffffffffffc0 = (reaper_t *)*ppiVar4;
    if (in_stack_ffffffffffffffc0 != (reaper_t *)0x0) {
      io_thread_t::~io_thread_t((io_thread_t *)in_stack_ffffffffffffffc0);
      operator_delete(in_stack_ffffffffffffffc0,0xe0);
    }
    ppiVar4 = std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::operator[]
                        ((vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_> *)
                         (in_RDI + 0x100),(size_type)this_00);
    *ppiVar4 = (value_type)0x0;
  }
  pvVar1 = *(void **)(in_RDI + 0xf8);
  if (pvVar1 != (void *)0x0) {
    reaper_t::~reaper_t(in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0xf0);
  }
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  random_close();
  *(undefined4 *)(in_RDI + 0x88) = 0xdeadbeef;
  mutex_t::~mutex_t(this_00);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>_>_>
               *)0x1d3f16);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
          *)0x1d3f27);
  mailbox_t::~mailbox_t((mailbox_t *)in_stack_ffffffffffffffc0);
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::~vector
            ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffd0));
  std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::~vector
            ((vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffd0));
  mutex_t::~mutex_t(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffd0));
  array_t<zmq::socket_base_t,_0>::~array_t((array_t<zmq::socket_base_t,_0> *)0x1d3f8d);
  thread_ctx_t::~thread_ctx_t((thread_ctx_t *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

zmq::ctx_t::~ctx_t ()
{
    //  Check that there are no remaining _sockets.
    zmq_assert (_sockets.empty ());

    //  Ask I/O threads to terminate. If stop signal wasn't sent to I/O
    //  thread subsequent invocation of destructor would hang-up.
    const io_threads_t::size_type io_threads_size = _io_threads.size ();
    for (io_threads_t::size_type i = 0; i != io_threads_size; i++) {
        _io_threads[i]->stop ();
    }

    //  Wait till I/O threads actually terminate.
    for (io_threads_t::size_type i = 0; i != io_threads_size; i++) {
        LIBZMQ_DELETE (_io_threads[i]);
    }

    //  Deallocate the reaper thread object.
    LIBZMQ_DELETE (_reaper);

    //  The mailboxes in _slots themselves were deallocated with their
    //  corresponding io_thread/socket objects.

    //  De-initialise crypto library, if needed.
    zmq::random_close ();

#ifdef ZMQ_USE_NSS
    NSS_Shutdown ();
#endif

#ifdef ZMQ_USE_GNUTLS
    gnutls_global_deinit ();
#endif

    //  Remove the tag, so that the object is considered dead.
    _tag = ZMQ_CTX_TAG_VALUE_BAD;
}